

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindLinearRoot.cpp
# Opt level: O0

void GeoCalcs::FindLinearRoot(double *x,double *errArray,double *root)

{
  bool bVar1;
  double dVar2;
  double *root_local;
  double *errArray_local;
  double *x_local;
  
  if ((*x != x[1]) || (NAN(*x) || NAN(x[1]))) {
    if ((*errArray != errArray[1]) || (NAN(*errArray) || NAN(errArray[1]))) {
      *root = (-*errArray * (x[1] - *x)) / (errArray[1] - *errArray) + *x;
    }
    else {
      bVar1 = IsNearZero(*errArray - errArray[1],1e-15);
      if (bVar1) {
        *root = *x;
      }
      else {
        dVar2 = std::numeric_limits<double>::signaling_NaN();
        *root = dVar2;
      }
    }
  }
  else {
    dVar2 = std::numeric_limits<double>::signaling_NaN();
    *root = dVar2;
  }
  return;
}

Assistant:

void FindLinearRoot(double *x, double *errArray, double &root)
    {
        if (x[0] == x[1])
        {
            root = std::numeric_limits<double>::signaling_NaN();
        }
        else if (errArray[0] == errArray[1])
        {
            if (IsNearZero(errArray[0] - errArray[1], 1e-15))
            {
                root = x[0];
            }
            else
            {
                root = numeric_limits<double>::signaling_NaN();
            }
        }
        else
        {
            root = -errArray[0] * (x[1] - x[0]) / (errArray[1] - errArray[0]) + x[0];
        }
    }